

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.h
# Opt level: O0

void bs_write_ue(bs_t *b,uint32_t v)

{
  uint v_00;
  int local_18;
  int len;
  uint32_t v_local;
  bs_t *b_local;
  
  if (v == 0) {
    bs_write_u1(b,1);
  }
  else {
    v_00 = v + 1;
    if (v_00 < 0x1000000) {
      if (v_00 < 0x10000) {
        if (v_00 < 0x100) {
          local_18 = bs_write_ue::len_table[v_00];
        }
        else {
          local_18 = bs_write_ue::len_table[v_00 >> 8] + 8;
        }
      }
      else {
        local_18 = bs_write_ue::len_table[v_00 >> 0x10] + 0x10;
      }
    }
    else {
      local_18 = bs_write_ue::len_table[v_00 >> 0x18] + 0x18;
    }
    bs_write_u(b,local_18 * 2 + -1,v_00);
  }
  return;
}

Assistant:

static inline void bs_write_ue(bs_t* b, uint32_t v)
{
    static const int len_table[256] =
            {
                    1,
                    1,
                    2,2,
                    3,3,3,3,
                    4,4,4,4,4,4,4,4,
                    5,5,5,5,5,5,5,5,5,5,5,5,5,5,5,5,
                    6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,
                    6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
            };

    int len;

    if (v == 0)
    {
        bs_write_u1(b, 1);
    }
    else
    {
        v++;

        if (v >= 0x01000000)
        {
            len = 24 + len_table[ v >> 24 ];
        }
        else if(v >= 0x00010000)
        {
            len = 16 + len_table[ v >> 16 ];
        }
        else if(v >= 0x00000100)
        {
            len =  8 + len_table[ v >>  8 ];
        }
        else
        {
            len = len_table[ v ];
        }

        bs_write_u(b, 2*len-1, v);
    }
}